

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

int tcg_gen_code_x86_64(TCGContext *s,TranslationBlock *tb)

{
  anon_union_16_2_aaf24f3d_for_link *paVar1;
  TCGTemp **ppTVar2;
  tcg_insn_unit **pptVar3;
  char **ppcVar4;
  ushort uVar5;
  TCGOp *pTVar6;
  TCGArg TVar7;
  tcg_insn_unit *ptVar8;
  tcg_target_ulong tVar9;
  TCGArgConstraint *pTVar10;
  TCGOpDef *pTVar11;
  ulong uVar12;
  uintptr_t value;
  TCGRegSet *pTVar13;
  uint *puVar14;
  anon_union_16_2_aaf24f3d_for_link *paVar15;
  tcg_insn_unit tVar16;
  byte bVar17;
  _Bool _Var18;
  TCGOpcode TVar19;
  TCGReg TVar20;
  int iVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  TCGOp *pTVar25;
  TCGOp *pTVar26;
  TCGTemp *pTVar27;
  TCGCond *pTVar28;
  byte *pbVar29;
  uint8_t *puVar30;
  QTailQLink *pQVar31;
  QTailQLink *extraout_RAX;
  void **ppvVar32;
  undefined8 extraout_RAX_00;
  TCGLifeData arg_life;
  uint uVar33;
  TCGRegSet TVar34;
  uint uVar35;
  TCGCond TVar36;
  TCGCond base;
  long lVar37;
  TCGOp *pTVar38;
  TCGContext *pTVar39;
  long lVar40;
  undefined1 *puVar41;
  QTailQLink *pQVar42;
  QTailQLink *pQVar43;
  ulong uVar44;
  TCGCond r;
  TCGArg TVar45;
  byte bVar46;
  TCGRegSet TVar47;
  TCGRegSet allocated_regs;
  int iVar48;
  TCGContext *pTVar49;
  undefined2 uVar51;
  uint uVar52;
  TCGContext *pTVar53;
  TCGOpcode TVar54;
  TCGType TVar55;
  uint uVar56;
  TCGTemp *pTVar57;
  ulong uVar58;
  uint uVar59;
  TCGTemp *pTVar60;
  TCGContext *pTVar61;
  TCGRegSet preferred_regs;
  uint uVar62;
  TCGContext *in_R9;
  TCGContext *pTVar63;
  byte bVar64;
  uint uVar65;
  int iVar66;
  ulong unaff_R12;
  long lVar67;
  TCGLabelQemuLdst *pTVar68;
  ulong uVar69;
  ulong uVar70;
  TCGContext *pTVar71;
  tcg_insn_unit **pptVar72;
  TCGLabel *pTVar73;
  TCGRelocation *pTVar74;
  bool bVar75;
  TCGArg new_args [16];
  TCGContext *in_stack_fffffffffffffe58;
  uint local_15c;
  TCGContext *local_118;
  TCGContext *local_110;
  TCGContext *local_108;
  tcg_insn_unit local_100;
  undefined4 uStack_fc;
  int local_f8;
  undefined4 uStack_f4;
  TCGCond local_f0;
  undefined4 uStack_ec;
  void **local_90;
  void **local_88;
  target_ulong (*local_80) [2];
  int local_78;
  int local_74;
  uint local_70;
  int local_68;
  int local_64;
  TCGContext *pTVar50;
  
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_x86_64(s,false,"TCG before optimization:");
  }
  tcg_optimize_x86_64(s);
  if ((s->ops).tqh_first != (TCGOp *)0x0) {
    uVar24 = 0;
    pTVar38 = (s->ops).tqh_first;
    do {
      pTVar6 = (pTVar38->link).tqe_next;
      uVar65 = *(uint *)pTVar38;
      uVar33 = uVar65 & 0xff;
      uVar44 = uVar24;
      if (uVar33 < 0x81) {
        if (uVar33 == 1) {
          uVar65 = *(uint *)pTVar38->args[0];
          unaff_R12 = CONCAT71((int7)(unaff_R12 >> 8),1);
          if (0xffff < uVar65) {
            if ((((uVar65 & 0xffff0000) == 0x10000) &&
                (pTVar25 = (TCGOp *)((pTVar38->link).tqe_circ.tql_prev)->tql_prev->tql_next,
                *(char *)pTVar25 == '\x03')) &&
               ((uint *)pTVar38->args[0] == (uint *)pTVar25->args[0])) {
              tcg_op_remove_x86_64(s,pTVar25);
            }
            else {
              unaff_R12 = 0;
            }
            uVar44 = 0;
          }
        }
        else if (uVar33 == 2) {
          unaff_R12 = uVar24;
          if ((pTVar38->args[(ulong)((uVar65 >> 8 & 0xf) + (uVar65 >> 0xc & 0xf)) + 1] & 8) != 0) {
            uVar44 = 1;
          }
        }
        else {
          unaff_R12 = uVar24;
          if (uVar33 == 3) goto LAB_004f1f65;
        }
      }
      else if (uVar33 == 0x81) {
        unaff_R12 = 0;
      }
      else if ((uVar33 == 0x82) || (unaff_R12 = uVar24, uVar33 == 0x84)) {
LAB_004f1f65:
        uVar44 = 1;
        unaff_R12 = uVar24;
      }
      if ((unaff_R12 & 1) != 0) {
        tcg_op_remove_x86_64(s,pTVar38);
      }
      uVar24 = uVar44;
      pTVar38 = pTVar6;
    } while (pTVar6 != (TCGOp *)0x0);
  }
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    iVar21 = s->nb_globals;
    if ((long)iVar21 < 1) {
      uVar24 = 0;
    }
    else {
      pTVar27 = s->temps;
      uVar24 = 0;
      pTVar57 = pTVar27;
      do {
        if ((pTVar57->field_0x4 & 2) == 0) {
          pTVar60 = (TCGTemp *)0x0;
        }
        else {
          iVar66 = s->nb_temps;
          s->nb_temps = iVar66 + 1;
          pTVar60 = pTVar27 + iVar66;
          ppcVar4 = &s->temps[iVar66].name;
          *ppcVar4 = (char *)0x0;
          ppcVar4[1] = (char *)0x0;
          ppTVar2 = &s->temps[iVar66].mem_base;
          *ppTVar2 = (TCGTemp *)0x0;
          ppTVar2[1] = (TCGTemp *)0x0;
          *(undefined8 *)(pTVar27 + iVar66) = 0;
          pTVar27[iVar66].val = 0;
          s->temps[iVar66].state_ptr = (void *)0x0;
          in_R9 = (TCGContext *)((ulong)(byte)pTVar57->field_0x3 << 0x18);
          *(TCGContext **)(pTVar27 + iVar66) = in_R9;
          *(ulong *)(pTVar27 + iVar66) =
               (ulong)((uint)(byte)pTVar57->field_0x2 << 0x10 | (uint)in_R9);
        }
        pTVar57->state_ptr = pTVar60;
        pTVar57->state = 1;
        uVar24 = uVar24 + 1;
        pTVar57 = pTVar57 + 1;
      } while ((long)iVar21 != uVar24);
    }
    if ((int)uVar24 < s->nb_temps) {
      lVar37 = (ulong)(uint)s->nb_temps - (uVar24 & 0xffffffff);
      ppvVar32 = &s->temps[uVar24 & 0xffffffff].state_ptr;
      do {
        *ppvVar32 = (void *)0x0;
        ppvVar32[-1] = (void *)0x1;
        ppvVar32 = ppvVar32 + 7;
        lVar37 = lVar37 + -1;
      } while (lVar37 != 0);
    }
    if ((s->ops).tqh_first != (TCGOp *)0x0) {
      bVar75 = false;
      pTVar38 = (s->ops).tqh_first;
      do {
        uVar65 = *(uint *)pTVar38;
        if ((uVar65 & 0xff) == 2) {
          pTVar61 = (TCGContext *)(ulong)(uVar65 >> 0xc & 0xf);
          uVar52 = uVar65 >> 8 & 0xf;
        }
        else {
          uVar33 = (uVar65 & 0xff) << 5;
          uVar52 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar33];
          pTVar61 = (TCGContext *)(ulong)(&s->tcg_op_defs->nb_oargs)[uVar33];
        }
        pTVar6 = (pTVar38->link).tqe_next;
        uVar65 = uVar65 >> 0x10;
        unaff_R12 = (ulong)uVar65;
        if (uVar52 != 0) {
          pTVar53 = (TCGContext *)(ulong)(uVar52 + (int)pTVar61);
          pTVar49 = pTVar61;
          do {
            TVar45 = pTVar38->args[(long)pTVar49];
            if (((TVar45 != 0) && (TVar7 = *(TCGArg *)(TVar45 + 0x30), TVar7 != 0)) &&
               (*(long *)(TVar45 + 0x28) == 1)) {
              TVar54 = INDEX_op_ld_i32;
              if (*(char *)(TVar45 + 3) != '\0') {
                TVar54 = INDEX_op_ld_i64;
              }
              pTVar25 = tcg_op_alloc(s,TVar54);
              (pTVar25->link).tqe_circ.tql_prev = (pTVar38->link).tqe_circ.tql_prev;
              (pTVar25->link).tqe_next = pTVar38;
              ((pTVar38->link).tqe_circ.tql_prev)->tql_next = pTVar25;
              (pTVar38->link).tqe_circ.tql_prev = (QTailQLink *)&pTVar25->link;
              pTVar25->args[0] = TVar7;
              pTVar25->args[1] = *(TCGArg *)(TVar45 + 0x10);
              pTVar25->args[2] = *(TCGArg *)(TVar45 + 0x18);
              *(undefined8 *)(TVar45 + 0x28) = 2;
            }
            pTVar49 = (TCGContext *)((long)&pTVar49->pool_cur + 1);
            pTVar39 = pTVar61;
          } while (pTVar49 < pTVar53);
          do {
            TVar45 = pTVar38->args[(long)pTVar39];
            if ((TVar45 != 0) && (*(TCGArg *)(TVar45 + 0x30) != 0)) {
              pTVar38->args[(long)pTVar39] = *(TCGArg *)(TVar45 + 0x30);
              bVar75 = true;
              if ((uVar65 >> ((byte)pTVar39 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar45 + 0x28) = 1;
              }
            }
            pTVar39 = (TCGContext *)((long)&pTVar39->pool_cur + 1);
          } while (pTVar39 < pTVar53);
        }
        in_R9 = pTVar61;
        if ((int)pTVar61 != 0) {
          paVar1 = &pTVar38->link;
          pTVar49 = (TCGContext *)0x0;
          do {
            TVar45 = pTVar38->args[(long)pTVar49];
            TVar7 = *(TCGArg *)(TVar45 + 0x30);
            if (TVar7 != 0) {
              pTVar38->args[(long)pTVar49] = TVar7;
              *(undefined8 *)(TVar45 + 0x28) = 0;
              if ((uVar65 >> ((uint)pTVar49 & 0x1f) & 1) != 0) {
                TVar54 = INDEX_op_st_i32;
                if (*(char *)(TVar45 + 3) != '\0') {
                  TVar54 = INDEX_op_st_i64;
                }
                pTVar26 = tcg_op_alloc(s,TVar54);
                pTVar25 = paVar1->tqe_next;
                (pTVar26->link).tqe_next = pTVar25;
                paVar15 = &pTVar25->link;
                if (pTVar25 == (TCGOp *)0x0) {
                  paVar15 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
                }
                (paVar15->tqe_circ).tql_prev = (QTailQLink *)&pTVar26->link;
                paVar1->tqe_next = pTVar26;
                (pTVar26->link).tqe_circ.tql_prev = (QTailQLink *)paVar1;
                pTVar26->args[0] = TVar7;
                pTVar26->args[1] = *(TCGArg *)(TVar45 + 0x10);
                pTVar26->args[2] = *(TCGArg *)(TVar45 + 0x18);
                *(undefined8 *)(TVar45 + 0x28) = 2;
              }
              bVar75 = true;
              if ((uVar65 >> ((byte)pTVar49 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar45 + 0x28) = 1;
              }
            }
            pTVar49 = (TCGContext *)((long)&pTVar49->pool_cur + 1);
          } while (pTVar61 != pTVar49);
        }
        pTVar38 = pTVar6;
      } while (pTVar6 != (TCGOp *)0x0);
      if (bVar75) {
        liveness_pass_1(s);
      }
    }
  }
  iVar21 = s->nb_globals;
  if ((long)iVar21 < 1) {
    uVar24 = 0;
  }
  else {
    pTVar27 = s->temps;
    uVar24 = 0;
    do {
      pTVar27->field_0x1 =
           (char)((uint)(((undefined1  [56])*pTVar27 & (undefined1  [56])0x100000000) ==
                        (undefined1  [56])0x0) * 0x100 + 0x100 >> 8);
      uVar24 = uVar24 + 1;
      pTVar27 = pTVar27 + 1;
    } while ((long)iVar21 != uVar24);
  }
  if ((int)uVar24 < s->nb_temps) {
    lVar37 = (ulong)(uint)s->nb_temps - (uVar24 & 0xffffffff);
    pTVar27 = s->temps + (uVar24 & 0xffffffff);
    do {
      *(ulong *)pTVar27 =
           *(ulong *)pTVar27 & 0xffffffeeffff00ff |
           (ulong)((uint)(*(ulong *)pTVar27 >> 0x1d) & 0x200);
      pTVar27 = pTVar27 + 1;
      lVar37 = lVar37 + -1;
    } while (lVar37 != 0);
  }
  ppTVar2 = s->reg_to_temp;
  memset(ppTVar2,0,0x100);
  ptVar8 = (tcg_insn_unit *)(tb->tc).ptr;
  s->code_buf = ptVar8;
  s->code_ptr = ptVar8;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_x86_64(s,false,"TCG before codegen:");
  }
  pptVar3 = &s->code_ptr;
  pTVar38 = (s->ops).tqh_first;
  if (pTVar38 == (TCGOp *)0x0) {
    local_15c = 0xffffffff;
  }
  else {
    local_88 = &s->tb_ret_addr;
    local_90 = &s->code_gen_epilogue;
    local_80 = s->gen_insn_data;
    local_15c = 0xffffffff;
    do {
      TVar54 = *(TCGOpcode *)pTVar38;
      TVar19 = TVar54 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
      arg_life = (TCGLifeData)(TVar54 >> 0x10);
      if (INDEX_op_ctpop_i32 < TVar19) {
        if (TVar19 < INDEX_op_mov_vec) {
          if (TVar19 != INDEX_op_mov_i64) {
            if (TVar19 != INDEX_op_insn_start) {
              if (TVar19 == INDEX_op_movi_i64) goto switchD_004f24f6_caseD_6;
              goto switchD_004f24f6_caseD_3;
            }
            if (((int)local_15c < 0) ||
               (uVar24 = (long)s->code_ptr - (long)s->code_buf,
               s->gen_insn_end_off[local_15c] = (uint16_t)uVar24, uVar24 < 0x10000)) {
              lVar37 = (long)(int)local_15c;
              local_15c = local_15c + 1;
              lVar40 = 0;
              do {
                local_80[lVar37 + 1][lVar40] = pTVar38->args[lVar40];
                lVar40 = lVar40 + 1;
              } while (lVar40 == 1);
              goto LAB_004f2a0b;
            }
            goto LAB_004f463f;
          }
        }
        else if (TVar19 != INDEX_op_mov_vec) {
          if (TVar19 != INDEX_op_dup_vec) {
            if (TVar19 == INDEX_op_dupi_vec) goto switchD_004f24f6_caseD_6;
            goto switchD_004f24f6_caseD_3;
          }
          pTVar27 = (TCGTemp *)pTVar38->args[0];
          pTVar57 = (TCGTemp *)pTVar38->args[1];
          uVar65 = *(uint *)pTVar57;
          uVar33 = uVar65 >> 8 & 0xff;
          if (uVar33 == 3) {
            tVar9 = pTVar57->val;
            if ((TVar54 >> 0x13 & 1) != 0) {
              temp_free_or_dead(s,pTVar57,1);
            }
            tcg_reg_alloc_do_movi(s,pTVar27,tVar9,arg_life,pTVar38->output_pref[0]);
            unaff_R12 = unaff_R12 & 0xffffffff;
            goto LAB_004f2a0b;
          }
          pTVar10 = s->tcg_op_defs[0x8b].args_ct;
          uVar52 = pTVar10[1].u.regs;
          if (((uint)*(ulong *)pTVar27 & 0xff00) != 0x100) {
            uVar22 = 1 << ((byte)uVar65 & 0x1f);
            if (uVar33 != 1 || (TVar54 & 0x80000) != INDEX_op_discard) {
              uVar22 = 0;
            }
            TVar20 = tcg_reg_alloc(s,(pTVar10->u).regs,uVar22 | s->reserved_regs,
                                   pTVar38->output_pref[0],(*(ulong *)pTVar27 & 0x400000000) != 0);
            *(ulong *)pTVar27 =
                 (*(ulong *)pTVar27 & 0xfffffff7ffff0000) + (ulong)(TVar20 & 0xff) + 0x100;
            s->reg_to_temp[TVar20 & 0xff] = pTVar27;
          }
          uVar33 = TVar54 >> 0xc & 0xf;
          TVar55 = (TVar54 >> 8 & 0xf) + TCG_TYPE_V64;
          uVar24 = *(ulong *)pTVar57;
          if ((char)(uVar24 >> 8) == '\x02') {
LAB_004f31f8:
            in_R9 = (TCGContext *)pTVar57->mem_offset;
            tcg_out_dupm_vec(s,TVar55,uVar33,(uint)*(byte *)pTVar27,(uint)*(byte *)pTVar57->mem_base
                             ,(intptr_t)in_R9);
          }
          else {
            if (((uint)(uVar24 >> 8) & 0xff) != 1) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ;
              iVar21 = 0xd22;
              goto LAB_004f466a;
            }
            TVar20 = (TCGReg)uVar24 & 0xff;
            if ((uVar52 >> ((TCGReg)uVar24 & TCG_REG_XMM15) & 1) == 0) {
              if ((uVar24 >> 0x23 & 1) != 0) goto LAB_004f31f8;
              tcg_out_mov(s,uVar65 >> 0x18,(uint)*(byte *)pTVar27,TVar20);
              bVar17 = *(byte *)pTVar27;
              TVar20 = (TCGReg)bVar17;
            }
            else {
              bVar17 = *(byte *)pTVar27;
            }
            tcg_out_dup_vec(s,TVar55,uVar33,(uint)bVar17,TVar20);
          }
          if ((TVar54 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar57,1);
          }
          if ((TVar54 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar27,s->reserved_regs,0,0);
          }
          if ((TVar54 >> 0x12 & 1) != 0) {
            temp_free_or_dead(s,pTVar27,1);
          }
          goto LAB_004f2a06;
        }
switchD_004f24f6_caseD_5:
        uVar65 = s->reserved_regs;
        TVar34 = pTVar38->output_pref[0];
        pTVar27 = (TCGTemp *)pTVar38->args[0];
        pTVar57 = (TCGTemp *)pTVar38->args[1];
        TVar55 = (TCGType)(byte)pTVar27->field_0x3;
        uVar24 = *(ulong *)pTVar57;
        if ((char)(uVar24 >> 8) == '\x02') {
          temp_load(s,pTVar57,s->tcg_target_available_regs[uVar24 >> 0x18 & 0xff],uVar65,TVar34);
        }
        else if (((uint)(uVar24 >> 8) & 0xff) == 3) {
          tVar9 = pTVar57->val;
          if ((TVar54 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar57,1);
          }
          tcg_reg_alloc_do_movi(s,pTVar27,tVar9,arg_life,TVar34);
          goto LAB_004f2a06;
        }
        if ((TVar54 >> 0x12 & 1) == 0) {
          uVar24 = *(ulong *)pTVar27;
          uVar33 = (uint)uVar24 & 0xff00;
          if (((TVar54 >> 0x13 & 1) == 0) || ((*(ulong *)pTVar57 & 0x100000000) != 0)) {
            if (uVar33 != 0x100) {
              uVar65 = uVar65 | 1 << ((uint)*(ulong *)pTVar57 & 0x1f);
              TVar20 = tcg_reg_alloc(s,s->tcg_target_available_regs[TVar55],uVar65,TVar34,
                                     (uVar24 & 0x400000000) != 0);
              *(char *)pTVar27 = (char)TVar20;
            }
            tcg_out_mov(s,TVar55,(uint)*(byte *)pTVar27,(uint)*(byte *)pTVar57);
          }
          else {
            if (uVar33 == 0x100) {
              ppTVar2[uVar24 & 0xff] = (TCGTemp *)0x0;
            }
            *(undefined1 *)pTVar27 = *(undefined1 *)pTVar57;
            temp_free_or_dead(s,pTVar57,1);
          }
          uVar24 = *(ulong *)pTVar27;
          *(ulong *)pTVar27 = uVar24 & 0xfffffff7ffff00ff | 0x100;
          ppTVar2[uVar24 & 0xff] = pTVar27;
          if ((TVar54 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar27,uVar65,0,0);
          }
        }
        else {
          if ((pTVar27->field_0x4 & 0x10) == 0) {
            temp_allocate_frame(s,pTVar27);
          }
          tcg_out_st(s,TVar55,(uint)*(byte *)pTVar57,(uint)*(byte *)pTVar27->mem_base,
                     pTVar27->mem_offset);
          if ((TVar54 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar57,1);
          }
          temp_free_or_dead(s,pTVar27,1);
        }
LAB_004f2a06:
        unaff_R12 = unaff_R12 & 0xffffffff;
        goto LAB_004f2a0b;
      }
      switch(TVar19) {
      case INDEX_op_discard:
        temp_free_or_dead(s,(TCGTemp *)pTVar38->args[0],1);
        goto LAB_004f2a0b;
      case INDEX_op_set_label:
        tcg_gen_code_x86_64_cold_19();
        goto LAB_004f2a0b;
      case INDEX_op_call:
        uVar33 = TVar54 >> 8 & 0xf;
        uVar65 = 6;
        if (uVar33 < 6) {
          uVar65 = TVar54 >> 8 & 0xf;
        }
        if (((long)(int)(uVar33 - uVar65) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
          uVar52 = TVar54 >> 0xc & 0xf;
          uVar24 = (ulong)uVar52;
          ptVar8 = (tcg_insn_unit *)pTVar38->args[uVar52 + uVar33];
          if (6 < uVar33) {
            lVar37 = 0;
            do {
              pTVar27 = *(TCGTemp **)((long)pTVar38->args + lVar37 + uVar24 * 8 + 0x30);
              if (pTVar27 != (TCGTemp *)0x0) {
                temp_load(s,pTVar27,s->tcg_target_available_regs[(byte)pTVar27->field_0x3],
                          s->reserved_regs,0);
                tcg_out_st(s,*(TCGReg *)pTVar27 >> 0x18,*(TCGReg *)pTVar27 & 0xff,TCG_REG_CALL_STACK
                           ,lVar37);
              }
              lVar37 = lVar37 + 8;
            } while ((ulong)uVar33 * 8 + -0x30 != lVar37);
          }
          uVar22 = s->reserved_regs;
          if (uVar33 != 0) {
            uVar44 = 0;
            do {
              pTVar27 = *(TCGTemp **)((long)pTVar38->args + uVar44 * 2 + uVar24 * 8);
              if (pTVar27 != (TCGTemp *)0x0) {
                TVar20 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar44);
                if (((TCGReg)*(undefined8 *)pTVar27 & 0xff00) == 0x100) {
                  if (((TCGReg)*(undefined8 *)pTVar27 & 0xff) != TVar20) {
                    if (ppTVar2[TVar20] != (TCGTemp *)0x0) {
                      temp_sync(s,ppTVar2[TVar20],uVar22,0,-1);
                    }
                    tcg_out_mov(s,*(TCGReg *)pTVar27 >> 0x18,TVar20,*(TCGReg *)pTVar27 & 0xff);
                  }
                }
                else {
                  if (ppTVar2[TVar20] != (TCGTemp *)0x0) {
                    temp_sync(s,ppTVar2[TVar20],uVar22,0,-1);
                  }
                  temp_load(s,pTVar27,1 << ((byte)TVar20 & 0x1f),uVar22,0);
                }
                uVar22 = uVar22 | 1 << (TVar20 & TCG_REG_XMM15);
              }
              uVar44 = uVar44 + 4;
            } while (uVar65 << 2 != uVar44);
          }
          uVar65 = TVar54 >> 0x10;
          uVar44 = uVar24;
          if (uVar33 != 0) {
            do {
              if ((uVar65 >> ((byte)uVar44 & 0x1f) & 4) != 0) {
                temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar44],1);
              }
              uVar44 = uVar44 + 1;
            } while (uVar44 < uVar52 + uVar33);
          }
          lVar37 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar37 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar37] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar37],uVar22,0,-1);
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 != 0x20);
          tcg_out_branch(s,1,ptVar8);
          if (uVar52 != 0) {
            uVar44 = 0;
            do {
              pTVar27 = (TCGTemp *)pTVar38->args[uVar44];
              if (((uint)*(ulong *)pTVar27 & 0xff00) == 0x100) {
                ppTVar2[*(ulong *)pTVar27 & 0xff] = (TCGTemp *)0x0;
              }
              *(ulong *)pTVar27 = *(ulong *)pTVar27 & 0xfffffff7ffff0000 | 0x100;
              *ppTVar2 = pTVar27;
              uVar33 = 4 << ((byte)uVar44 & 0x1f) & uVar65;
              if ((uVar65 >> ((uint)uVar44 & 0x1f) & 1) == 0) {
                if (uVar33 != 0) {
                  temp_free_or_dead(s,pTVar27,1);
                }
              }
              else {
                temp_sync(s,pTVar27,uVar22,0,uVar33);
              }
              uVar44 = uVar44 + 1;
            } while (uVar24 != uVar44);
          }
          goto LAB_004f2a06;
        }
        tcg_gen_code_x86_64_cold_1();
        goto switchD_004f43c3_caseD_7;
      case INDEX_op_mov_i32:
        goto switchD_004f24f6_caseD_5;
      case INDEX_op_movi_i32:
switchD_004f24f6_caseD_6:
        tcg_gen_code_x86_64_cold_20();
        goto LAB_004f2a0b;
      }
switchD_004f24f6_caseD_3:
      tcg_op_supported_x86_64(TVar54 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
      uVar65 = TVar54 >> 0x10;
      pTVar11 = s->tcg_op_defs;
      uVar69 = (ulong)((TVar54 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
      uVar44 = (ulong)(&pTVar11->nb_oargs)[uVar69];
      bVar17 = (&pTVar11->nb_iargs)[uVar69];
      uVar24 = (ulong)bVar17;
      lVar37 = (ulong)(&pTVar11->nb_oargs)[uVar69] * 8;
      pTVar61 = (TCGContext *)((long)&stack0xfffffffffffffee8 + (ulong)((uint)bVar17 * 8) + lVar37);
      memcpy(pTVar61,(void *)((long)pTVar38->args + (ulong)((uint)bVar17 * 8) + lVar37),
             (ulong)(&pTVar11->nb_cargs)[uVar69] << 3);
      TVar34 = s->reserved_regs;
      allocated_regs = TVar34;
      if (bVar17 != 0) {
        uVar70 = 0;
        do {
          lVar37 = *(long *)((long)&pTVar11->args_ct + uVar69);
          lVar40 = *(long *)((long)&pTVar11->sorted_args + uVar69);
          iVar21 = *(int *)(lVar40 + uVar70 * 4 + uVar44 * 4);
          lVar67 = (long)iVar21;
          pTVar27 = (TCGTemp *)pTVar38->args[lVar67];
          uVar12 = *(ulong *)pTVar27;
          uVar33 = (uint)uVar12 & 0xff00;
          in_R9 = s;
          if (uVar33 == 0x300) {
            uVar58 = pTVar27->val;
            uVar5 = *(ushort *)(lVar37 + lVar67 * 8);
            pTVar61 = (TCGContext *)(ulong)uVar5;
            if (((((uVar5 & 2) == 0) && (((long)(int)uVar58 != uVar58 || ((uVar5 & 0x100) == 0))))
                && ((uVar58 >> 0x20 != 0 || ((uVar5 & 0x200) == 0)))) &&
               (((uVar58 + 0x80000000 >> 0x20 != 0 || ((uVar5 & 0x400) == 0)) &&
                (((uVar5 >> 0xb & 1) == 0 ||
                 (pTVar61 = (TCGContext *)(uVar12 >> 0x18),
                 (ulong)((char)(uVar12 >> 0x18) != '\0') * 0x20 + 0x20 != uVar58))))))
            goto LAB_004f2ce5;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar67 * 4) = 1;
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar67 * 8) = uVar58;
          }
          else {
LAB_004f2ce5:
            if ((*(byte *)(lVar37 + lVar67 * 8) & 0x40) == 0) {
              TVar47 = 0;
              preferred_regs = 0;
LAB_004f2cf2:
              pTVar61 = s;
              temp_load(s,pTVar27,*(TCGRegSet *)(lVar37 + 4 + lVar67 * 8),allocated_regs,
                        preferred_regs);
              if ((*(uint *)(lVar37 + 4 + lVar67 * 8) >> (*(TCGReg *)pTVar27 & TCG_REG_XMM15) & 1)
                  == 0) goto LAB_004f2dad;
              TVar20 = *(TCGReg *)pTVar27 & 0xff;
            }
            else {
              bVar17 = *(byte *)(lVar37 + 2 + lVar67 * 8);
              TVar47 = pTVar38->output_pref[bVar17];
              if ((uVar12 & 0x100000000) == 0) {
                uVar52 = uVar65 >> ((byte)iVar21 & 0x1f);
                pTVar61 = (TCGContext *)(ulong)uVar52;
                if ((uVar52 & 4) != 0) {
                  preferred_regs = TVar47;
                  if (uVar33 == 0x100) {
                    iVar21 = 0;
                    if (uVar70 != 0) {
                      uVar58 = 0;
                      do {
                        pTVar61 = (TCGContext *)(long)*(int *)(lVar40 + uVar44 * 4 + uVar58 * 4);
                        if (((*(byte *)(lVar37 + (long)pTVar61 * 8) & 0x40) != 0) &&
                           ((uVar12 & 0xff) ==
                            *(ulong *)((long)&stack0xfffffffffffffee8 + (long)pTVar61 * 8))) {
                          iVar21 = 5;
                          break;
                        }
                        uVar58 = uVar58 + 1;
                      } while (uVar70 != uVar58);
                    }
                    if (iVar21 == 5) goto LAB_004f2dad;
                    if (iVar21 != 0) goto LAB_004f2e49;
                  }
                  goto LAB_004f2cf2;
                }
              }
              else {
                preferred_regs = 0;
                if (pTVar27 == (TCGTemp *)pTVar38->args[bVar17]) goto LAB_004f2cf2;
              }
LAB_004f2dad:
              temp_load(s,pTVar27,s->tcg_target_available_regs[(byte)pTVar27->field_0x3],
                        allocated_regs,0);
              TVar20 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar37 + 4 + lVar67 * 8),allocated_regs,TVar47
                                     ,((undefined1  [56])*pTVar27 & (undefined1  [56])0x400000000)
                                      != (undefined1  [56])0x0);
              pTVar61 = s;
              tcg_out_mov(s,*(TCGReg *)pTVar27 >> 0x18,TVar20,*(TCGReg *)pTVar27 & 0xff);
            }
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar67 * 8) = (ulong)TVar20;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar67 * 4) = 0;
            allocated_regs = allocated_regs | 1 << (TVar20 & TCG_REG_XMM15);
          }
LAB_004f2e49:
          uVar70 = uVar70 + 1;
        } while (uVar70 != uVar24);
      }
      if (uVar24 != 0) {
        uVar70 = uVar44;
        do {
          if ((uVar65 >> ((byte)uVar70 & 0x1f) & 4) != 0) {
            pTVar61 = s;
            temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar70],1);
          }
          uVar70 = uVar70 + 1;
        } while (uVar70 < uVar24 + uVar44);
      }
      if (((&pTVar11->flags)[uVar69] & 2) == 0) {
        if (((&pTVar11->flags)[uVar69] & 4) != 0) {
          lVar37 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar37 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar37] != (TCGTemp *)0x0)) {
              pTVar61 = s;
              temp_sync(s,s->reg_to_temp[lVar37],allocated_regs,0,-1);
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 != 0x20);
        }
        if (uVar44 != 0) {
          uVar24 = 0;
          do {
            lVar37 = *(long *)((long)&pTVar11->args_ct + uVar69);
            lVar40 = (long)*(int *)(*(long *)((long)&pTVar11->sorted_args + uVar69) + uVar24 * 4);
            pTVar27 = (TCGTemp *)pTVar38->args[lVar40];
            uVar5 = *(ushort *)(lVar37 + lVar40 * 8);
            if (((char)uVar5 < '\0') &&
               (uVar70 = (ulong)*(byte *)(lVar37 + 2 + lVar40 * 8),
               *(int *)((long)&stack0xffffffffffffff88 + uVar70 * 4) == 0)) {
              TVar20 = *(TCGReg *)((long)&stack0xfffffffffffffee8 + uVar70 * 8);
            }
            else {
              if ((uVar5 & 0x20) == 0) {
                TVar47 = pTVar38->output_pref[uVar24];
                uVar33 = TVar34;
              }
              else {
                uVar33 = TVar34 | allocated_regs;
                TVar47 = pTVar38->output_pref[uVar24];
              }
              pTVar61 = s;
              TVar20 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar37 + 4 + lVar40 * 8),uVar33,TVar47,
                                     ((undefined1  [56])*pTVar27 & (undefined1  [56])0x400000000) !=
                                     (undefined1  [56])0x0);
            }
            if (((uint)*(ulong *)pTVar27 & 0xff00) == 0x100) {
              ppTVar2[*(ulong *)pTVar27 & 0xff] = (TCGTemp *)0x0;
            }
            TVar34 = TVar34 | 1 << (TVar20 & TCG_REG_XMM15);
            *(ulong *)pTVar27 =
                 (*(ulong *)pTVar27 & 0xfffffff7ffff0000) + (ulong)(byte)TVar20 + 0x100;
            ppTVar2[TVar20] = pTVar27;
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar40 * 8) = (ulong)TVar20;
            uVar24 = uVar24 + 1;
          } while (uVar44 != uVar24);
        }
      }
      uVar52 = local_70;
      pTVar53 = local_108;
      pTVar49 = local_118;
      uVar33 = *(uint *)pTVar38;
      r = (TCGCond)local_118;
      bVar17 = (byte)local_110;
      base = (TCGCond)local_110;
      bVar46 = (byte)local_118;
      bVar64 = (byte)local_108;
      TVar36 = (TCGCond)local_108;
      pTVar39 = local_110;
      pTVar71 = local_110;
      if (((&pTVar11->flags)[uVar69] & 0x40) != 0) {
        if (0x2b < (uVar33 & 0xff) - 0x8d) {
switchD_004f30e6_caseD_93:
          pcVar23 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
          ;
          iVar21 = 0xb75;
LAB_004f466a:
          g_assertion_message_expr(pcVar23,iVar21,(char *)0x0);
        }
        uVar52 = uVar33 >> 0xc & 0xf;
        uVar24 = (ulong)uVar52;
        TVar55 = (uVar33 >> 8 & 0xf) + TCG_TYPE_V64;
        iVar21 = (int)in_R9;
        switch(uVar33 & 0xff) {
        case 0x8d:
          goto LAB_004f397e;
        case 0x8e:
          goto LAB_004f4084;
        case 0x8f:
          in_R9 = local_108;
          tcg_out_dupm_vec(s,TVar55,uVar52,r,base,(intptr_t)local_108);
          goto LAB_004f3724;
        case 0x90:
          uVar33 = *(uint *)(tcg_out_vec_op_add_insn + uVar24 * 4);
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_004f36ea;
        case 0x91:
          puVar41 = tcg_out_vec_op_sub_insn;
          break;
        case 0x92:
          puVar41 = tcg_out_vec_op_mul_insn;
          break;
        default:
          goto switchD_004f30e6_caseD_93;
        case 0x94:
          uVar33 = *(uint *)(tcg_out_vec_op_abs_insn + uVar24 * 4);
          TVar36 = TCG_COND_NEVER;
          goto LAB_004f36ea;
        case 0x95:
          puVar41 = tcg_out_vec_op_ssadd_insn;
          break;
        case 0x96:
          puVar41 = tcg_out_vec_op_usadd_insn;
          break;
        case 0x97:
          puVar41 = tcg_out_vec_op_sssub_insn;
          break;
        case 0x98:
          puVar41 = tcg_out_vec_op_ussub_insn;
          break;
        case 0x99:
          puVar41 = tcg_out_vec_op_smin_insn;
          break;
        case 0x9a:
          puVar41 = tcg_out_vec_op_umin_insn;
          break;
        case 0x9b:
          puVar41 = tcg_out_vec_op_smax_insn;
          break;
        case 0x9c:
          puVar41 = tcg_out_vec_op_umax_insn;
          break;
        case 0x9d:
          uVar33 = 0x5db;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_004f36ea;
        case 0x9e:
          uVar33 = 0x5eb;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_004f36ea;
        case 0x9f:
          uVar33 = 0x5ef;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_004f36ea;
        case 0xa0:
          uVar22 = (uint)(TVar55 == TCG_TYPE_V256) << 0x13 | 0x5df;
          goto LAB_004f3701;
        case 0xa3:
          iVar66 = 6;
          goto LAB_004f336e;
        case 0xa4:
          iVar66 = 2;
          goto LAB_004f336e;
        case 0xa5:
          iVar66 = 4;
LAB_004f336e:
          uVar33 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar24 * 4) | 0x80000;
          if (TVar55 != TCG_TYPE_V256) {
            uVar33 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar24 * 4);
          }
          tcg_out_vex_opc(s,uVar33,iVar66,r,base,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + (char)iVar66 * '\b' | 0xc0;
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar64;
          goto LAB_004f3724;
        case 0xa6:
          puVar41 = tcg_out_vec_op_shls_insn;
          break;
        case 0xa7:
          puVar41 = tcg_out_vec_op_shrs_insn;
          break;
        case 0xa8:
          puVar41 = tcg_out_vec_op_sars_insn;
          break;
        case 0xa9:
          puVar41 = tcg_out_vec_op_shlv_insn;
          break;
        case 0xaa:
          puVar41 = tcg_out_vec_op_shrv_insn;
          break;
        case 0xab:
          puVar41 = tcg_out_vec_op_sarv_insn;
          break;
        case 0xac:
          if (_local_100 == TCG_COND_GT) {
            puVar41 = tcg_out_vec_op_cmpgt_insn;
          }
          else {
            if (_local_100 != TCG_COND_EQ) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar21 = 0xb20;
              goto LAB_004f466a;
            }
            puVar41 = tcg_out_vec_op_cmpeq_insn;
          }
          break;
        case 0xb0:
          uVar33 = 0x1c6;
          goto LAB_004f350b;
        case 0xb1:
          tcg_out_vex_opc(s,(uint)(TVar55 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar36,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar64 & 7) + bVar46 * '\b' | 0xc0;
          tVar16 = local_100 << 4;
          goto LAB_004f3db5;
        case 0xb2:
          uVar33 = 0x1040e;
          if (uVar52 != 1) {
            if (uVar52 != 2) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar21 = 0xb53;
              goto LAB_004f466a;
            }
            uVar33 = 0x1040c;
            if (have_avx2_x86_64 != false) {
              uVar33 = 0x10402;
            }
          }
          goto LAB_004f350b;
        case 0xb3:
          puVar41 = tcg_out_vec_op_packss_insn;
          break;
        case 0xb4:
          puVar41 = tcg_out_vec_op_packus_insn;
          break;
        case 0xb5:
          tcg_out_vex_opc(s,0x573,3,r,base,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar17 & 7 | 0xd8;
          goto LAB_004f3818;
        case 0xb6:
          uVar33 = 0x90446;
LAB_004f350b:
          tVar16 = local_100;
          uVar52 = uVar33 | 0x80000;
          if (TVar55 != TCG_TYPE_V256) {
            uVar52 = uVar33;
          }
          tcg_out_vex_opc(s,uVar52,r,base,TVar36,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar64 & 7) + bVar46 * '\b' | 0xc0;
          ptVar8 = s->code_ptr;
          s->code_ptr = ptVar8 + 1;
          *ptVar8 = tVar16;
          goto LAB_004f3724;
        case 0xb7:
          puVar41 = tcg_out_vec_op_punpckl_insn;
          break;
        case 0xb8:
          puVar41 = tcg_out_vec_op_punpckh_insn;
        }
        uVar33 = *(uint *)(puVar41 + uVar24 * 4);
        pTVar71 = local_108;
        TVar36 = base;
LAB_004f36ea:
        uVar22 = uVar33 | 0x80000;
        if (TVar55 != TCG_TYPE_V256) {
          uVar22 = uVar33;
        }
        pTVar39 = (TCGContext *)((ulong)pTVar71 & 0xffffffff);
LAB_004f3701:
        tcg_out_vex_opc(s,uVar22,r,TVar36,(int)pTVar39,(int)in_R9);
        TVar36 = (TCGCond)pTVar71;
        goto LAB_004f3706;
      }
      uVar35 = (uVar33 & 0xff) - 3;
      if (0x85 < uVar35) {
switchD_004f308a_caseD_5:
        tcg_gen_code_x86_64_cold_21();
LAB_004f46a0:
        tcg_gen_code_x86_64_cold_2();
        uVar65 = pTVar61->nb_globals;
        uVar33 = pTVar61->nb_temps;
        uVar22 = uVar33 * 4 + 7;
        uVar52 = uVar33 * 4 + 0xe;
        if (-1 < (int)uVar22) {
          uVar52 = uVar22;
        }
        puVar30 = pTVar61->pool_cur;
        if (pTVar61->pool_end < puVar30 + (int)(uVar52 & 0xfffffff8)) {
          puVar30 = (uint8_t *)tcg_malloc_internal_x86_64(pTVar61,uVar52 & 0xfffffff8);
        }
        else {
          pTVar61->pool_cur = puVar30 + (int)(uVar52 & 0xfffffff8);
        }
        if (0 < (int)uVar33) {
          lVar37 = 0;
          do {
            *(uint8_t **)((long)&pTVar61->temps[0].state_ptr + lVar37) = puVar30;
            puVar30 = puVar30 + 4;
            lVar37 = lVar37 + 0x38;
          } while ((ulong)uVar33 * 0x38 - lVar37 != 0);
        }
        la_func_end(pTVar61,uVar65,uVar33);
        pQVar31 = ((pTVar61->ops).tqh_circ.tql_prev)->tql_prev;
        if ((TCGOp *)pQVar31->tql_next == (TCGOp *)0x0) goto LAB_004f4db5;
        lVar37 = (ulong)uVar65 * 0x38;
        pTVar38 = (TCGOp *)pQVar31->tql_next;
        do {
          pTVar6 = (TCGOp *)((pTVar38->link).tqe_circ.tql_prev)->tql_prev->tql_next;
          uVar52 = *(uint *)pTVar38;
          uVar22 = uVar52 & 0xff;
          uVar35 = uVar22 << 5;
          pTVar11 = pTVar61->tcg_op_defs;
          if (uVar22 < 0x7b) {
            if (0x27 < uVar22) {
              uVar59 = 0x13;
              if (1 < uVar22 - 0x29) {
                if (uVar22 == 0x28) {
                  uVar59 = 0x12;
                  goto LAB_004f482a;
                }
                goto switchD_004f47d7_caseD_7f;
              }
LAB_004f47ed:
              pQVar42 = (QTailQLink *)&DAT_00000002;
              uVar56 = 2;
              if (*(long *)(pTVar38->args[1] + 0x28) == 1) {
                TVar45 = pTVar38->args[0];
                lVar40 = 0x30;
                goto LAB_004f4840;
              }
              goto LAB_004f488d;
            }
            if (uVar22 != 0) {
              if (uVar22 != 2) {
                uVar59 = 0x11;
                if (uVar22 == 0x27) goto LAB_004f482a;
                goto switchD_004f47d7_caseD_7f;
              }
              uVar22 = uVar52 >> 0xc & 0xf;
              uVar24 = (ulong)uVar22;
              uVar52 = uVar52 >> 8 & 0xf;
              TVar45 = pTVar38->args[(ulong)(uVar52 + uVar22) + 1];
              if ((TVar45 & 4) == 0) {
LAB_004f4ac0:
                if (uVar22 == 0) {
                  uVar35 = 0;
                }
                else {
                  uVar44 = 0;
                  uVar35 = 0;
                  do {
                    TVar7 = pTVar38->args[uVar44];
                    uVar59 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 1) != 0) {
                      uVar59 = 4 << ((byte)uVar44 & 0x1f);
                    }
                    uVar56 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 2) != 0) {
                      uVar56 = 1 << ((byte)uVar44 & 0x1f);
                    }
                    uVar35 = uVar35 | uVar56 | uVar59;
                    *(undefined8 *)(TVar7 + 0x28) = 1;
                    **(undefined4 **)(TVar7 + 0x30) = 0;
                    pTVar38->output_pref[uVar44] = 0;
                    uVar44 = uVar44 + 1;
                  } while (uVar24 != uVar44);
                }
                uVar51 = (undefined2)uVar35;
                if ((TVar45 & 3) == 0) {
                  if (0 < (int)uVar65) {
                    lVar40 = 0;
                    do {
                      *(undefined8 *)((long)&pTVar61->temps[0].state + lVar40) = 3;
                      **(TCGRegSet **)((long)&pTVar61->temps[0].state_ptr + lVar40) =
                           pTVar61->tcg_target_available_regs
                           [(byte)(&pTVar61->temps[0].field_0x3)[lVar40]];
                      lVar40 = lVar40 + 0x38;
                    } while (lVar37 != lVar40);
                  }
                }
                else if ((TVar45 & 1) == 0) {
                  la_global_sync(pTVar61,uVar65);
                }
                uVar44 = uVar24;
                if (uVar52 != 0) {
                  do {
                    if ((pTVar38->args[uVar44] != 0) &&
                       ((*(byte *)(pTVar38->args[uVar44] + 0x28) & 1) != 0)) {
                      uVar35 = uVar35 | 4 << ((byte)uVar44 & 0x1f);
                    }
                    uVar51 = (undefined2)uVar35;
                    uVar44 = uVar44 + 1;
                  } while (uVar44 < uVar52 + uVar22);
                }
                la_cross_call(pTVar61,uVar33);
                pQVar31 = (QTailQLink *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                if (uVar52 != 0) {
                  uVar44 = 0;
                  do {
                    TVar45 = pTVar38->args[uVar24 + uVar44];
                    if ((TVar45 != 0) && (uVar69 = *(ulong *)(TVar45 + 0x28), (uVar69 & 1) != 0)) {
                      TVar34 = 0;
                      if (5 < uVar44) {
                        TVar34 = pTVar61->tcg_target_available_regs[*(byte *)(TVar45 + 3)];
                      }
                      **(TCGRegSet **)(TVar45 + 0x30) = TVar34;
                      *(ulong *)(TVar45 + 0x28) = uVar69 & 0xfffffffffffffffe;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar52 != uVar44);
                  if (5 < uVar52) {
                    uVar52 = 6;
                  }
                  uVar44 = 0;
                  do {
                    lVar40 = *(long *)((long)pTVar38->args + uVar44 * 2 + uVar24 * 8);
                    if (lVar40 != 0) {
                      puVar14 = *(uint **)(lVar40 + 0x30);
                      *puVar14 = *puVar14 |
                                 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar44) & 0x1f);
                    }
                    uVar44 = uVar44 + 4;
                  } while (uVar52 << 2 != uVar44);
                }
              }
              else {
                if (uVar22 != 0) {
                  uVar44 = 0;
                  do {
                    if (*(long *)(pTVar38->args[uVar44] + 0x28) != 1) goto LAB_004f4ac0;
                    uVar44 = uVar44 + 1;
                  } while (uVar24 != uVar44);
                }
                uVar51 = 0;
                pQVar31 = (QTailQLink *)0x0;
              }
              if ((char)pQVar31 != '\0') goto LAB_004f4b55;
              goto LAB_004f4849;
            }
            TVar45 = pTVar38->args[0];
            *(undefined8 *)(TVar45 + 0x28) = 1;
            pQVar31 = *(QTailQLink **)(TVar45 + 0x30);
            *(undefined4 *)&pQVar31->tql_next = 0;
switchD_004f47d7_caseD_81:
            uVar51 = 0;
          }
          else {
            if (uVar22 - 0x7b < 7) {
              pQVar31 = (QTailQLink *)
                        ((long)&switchD_004f47d7::switchdataD_00d63ee8 +
                        (long)(int)(&switchD_004f47d7::switchdataD_00d63ee8)[uVar22 - 0x7b]);
              switch(uVar22) {
              case 0x7b:
                uVar59 = 0x4e;
                break;
              case 0x7c:
                uVar59 = 0x4f;
                break;
              default:
                uVar59 = 0x50;
                goto LAB_004f47ed;
              case 0x7f:
              case 0x80:
                goto switchD_004f47d7_caseD_7f;
              case 0x81:
                goto switchD_004f47d7_caseD_81;
              }
LAB_004f482a:
              if (*(long *)(pTVar38->args[1] + 0x28) == 1) {
                TVar45 = pTVar38->args[0];
                lVar40 = 0x38;
LAB_004f4840:
                if (*(long *)(TVar45 + 0x28) == 1) goto LAB_004f4847;
                *(uint *)pTVar38 = uVar52 & 0xffffff00 | uVar59;
                pTVar38->args[1] = pTVar38->args[2];
                pTVar38->args[2] = *(TCGArg *)((long)pTVar38->args + lVar40 + -0x18);
                uVar56 = 2;
                pQVar42 = (QTailQLink *)&DAT_00000001;
                uVar22 = uVar59;
              }
              else {
                uVar56 = 4;
                pQVar42 = (QTailQLink *)&DAT_00000002;
              }
            }
            else {
switchD_004f47d7_caseD_7f:
              bVar17 = (&pTVar11->nb_oargs)[uVar35];
              pQVar42 = (QTailQLink *)(ulong)bVar17;
              uVar56 = (uint)(&pTVar11->nb_iargs)[uVar35];
              if (bVar17 != 0 && ((&pTVar11->flags)[uVar35] & 8) == 0) {
                uVar24 = 0;
                do {
                  if (*(long *)(pTVar38->args[uVar24] + 0x28) != 1) goto LAB_004f488d;
                  uVar24 = uVar24 + 1;
                } while (bVar17 != uVar24);
LAB_004f4847:
                uVar51 = 0;
LAB_004f4849:
                tcg_op_remove_x86_64(pTVar61,pTVar38);
                pQVar31 = extraout_RAX;
                goto LAB_004f4b55;
              }
            }
LAB_004f488d:
            if ((char)pQVar42 == '\0') {
              uVar52 = 0;
            }
            else {
              pQVar31 = (QTailQLink *)0x0;
              uVar52 = 0;
              do {
                TVar45 = pTVar38->args[(long)pQVar31];
                pTVar13 = *(TCGRegSet **)(TVar45 + 0x30);
                pTVar38->output_pref[(long)pQVar31] = *pTVar13;
                uVar59 = 4 << ((byte)pQVar31 & 0x1f);
                if ((*(ulong *)(TVar45 + 0x28) & 1) == 0) {
                  uVar59 = 0;
                }
                uVar62 = 1 << ((byte)pQVar31 & 0x1f);
                if ((*(ulong *)(TVar45 + 0x28) & 2) == 0) {
                  uVar62 = 0;
                }
                uVar52 = uVar52 | uVar62 | uVar59;
                *(undefined8 *)(TVar45 + 0x28) = 1;
                *pTVar13 = 0;
                pQVar31 = (QTailQLink *)((long)&pQVar31->tql_next + 1);
              } while (pQVar42 != pQVar31);
            }
            bVar17 = (&pTVar11->flags)[uVar35];
            if ((bVar17 & 1) == 0) {
              if ((bVar17 & 2) == 0) {
                if (((bVar17 & 8) != 0) &&
                   (la_global_sync(pTVar61,uVar65), ((&pTVar11->flags)[uVar35] & 4) != 0)) {
                  la_cross_call(pTVar61,uVar33);
                }
              }
              else if (uVar22 == 0x26) {
                if (0 < (int)uVar65) {
                  lVar40 = 0;
                  do {
                    pbVar29 = (byte *)((long)&pTVar61->temps[0].state + lVar40);
                    *pbVar29 = *pbVar29 | 2;
                    lVar40 = lVar40 + 0x38;
                  } while (lVar37 != lVar40);
                }
              }
              else {
                if (0 < (int)uVar65) {
                  lVar40 = 0;
                  do {
                    *(undefined8 *)((long)&pTVar61->temps[0].state + lVar40) = 3;
                    **(TCGRegSet **)((long)&pTVar61->temps[0].state_ptr + lVar40) =
                         pTVar61->tcg_target_available_regs
                         [(byte)(&pTVar61->temps[0].field_0x3)[lVar40]];
                    lVar40 = lVar40 + 0x38;
                  } while (lVar37 != lVar40);
                }
                ppvVar32 = &pTVar61->temps[(int)uVar65].state_ptr;
                lVar40 = (long)(int)uVar33 - (long)(int)uVar65;
                if ((int)uVar65 < (int)uVar33) {
                  do {
                    uVar24 = *(ulong *)(ppvVar32 + -6) & 0x4000000000;
                    TVar34 = 0;
                    ppvVar32[-1] = (void *)((uVar24 >> 0x26) * 2 + 1);
                    if (uVar24 != 0) {
                      TVar34 = pTVar61->tcg_target_available_regs
                               [*(ulong *)(ppvVar32 + -6) >> 0x18 & 0xff];
                    }
                    *(TCGRegSet *)*ppvVar32 = TVar34;
                    ppvVar32 = ppvVar32 + 7;
                    lVar40 = lVar40 + -1;
                  } while (lVar40 != 0);
                }
              }
            }
            else {
              la_func_end(pTVar61,uVar65,uVar33);
            }
            pQVar31 = (QTailQLink *)(ulong)((int)pQVar42 + uVar56);
            pQVar43 = pQVar42;
            if (uVar56 != 0) {
              do {
                uVar59 = 0;
                if ((*(byte *)(pTVar38->args[(long)pQVar43] + 0x28) & 1) != 0) {
                  uVar59 = 4 << ((byte)pQVar43 & 0x1f);
                }
                uVar52 = uVar52 | uVar59;
                pQVar43 = (QTailQLink *)((long)&pQVar43->tql_next + 1);
              } while (pQVar43 < pQVar31);
            }
            uVar51 = (undefined2)uVar52;
            pQVar43 = pQVar42;
            if (uVar56 != 0) {
              do {
                TVar45 = pTVar38->args[(long)pQVar43];
                uVar24 = *(ulong *)(TVar45 + 0x28);
                if ((uVar24 & 1) != 0) {
                  **(TCGRegSet **)(TVar45 + 0x30) =
                       pTVar61->tcg_target_available_regs[*(byte *)(TVar45 + 3)];
                  *(ulong *)(TVar45 + 0x28) = uVar24 & 0xfffffffffffffffe;
                }
                pQVar43 = (QTailQLink *)((long)&pQVar43->tql_next + 1);
              } while (pQVar43 < pQVar31);
            }
            if ((uVar22 == 5) || (uVar22 == 0x3f)) {
              if ((uVar52 & 8) != 0) {
                pQVar31 = *(QTailQLink **)(pTVar38->args[0] + 0x30);
                *(undefined4 *)&pQVar31->tql_next = **(undefined4 **)(pTVar38->args[1] + 0x30);
              }
            }
            else if (uVar56 != 0) {
              lVar40 = *(long *)((long)&pTVar11->args_ct + (ulong)uVar35);
              do {
                puVar14 = *(uint **)(pTVar38->args[(long)pQVar42] + 0x30);
                uVar52 = *(uint *)(lVar40 + 4 + (long)pQVar42 * 8);
                uVar22 = *puVar14 & uVar52;
                if ((*(byte *)(lVar40 + (long)pQVar42 * 8) & 0x40) != 0) {
                  uVar22 = uVar22 & pTVar38->output_pref[*(byte *)(lVar40 + 2 + (long)pQVar42 * 8)];
                }
                if (uVar22 != 0) {
                  uVar52 = uVar22;
                }
                *puVar14 = uVar52;
                pQVar42 = (QTailQLink *)((long)&pQVar42->tql_next + 1);
              } while (pQVar42 < pQVar31);
            }
          }
LAB_004f4b55:
          *(undefined2 *)&pTVar38->field_0x2 = uVar51;
          pTVar38 = pTVar6;
          if (pTVar6 == (TCGOp *)0x0) {
LAB_004f4db5:
            return (int)pQVar31;
          }
        } while( true );
      }
      pTVar63 = (TCGContext *)(ulong)local_70;
      iVar66 = 0x402f7;
      pTVar50 = (TCGContext *)0x5;
      iVar48 = 5;
      in_R9 = (TCGContext *)0x0;
      uVar22 = 0;
      uVar56 = 0;
      iVar21 = 5;
      uVar59 = 0;
      switch(uVar33 & 0xff) {
      case 3:
        tcg_out_jxx(s,-1,(TCGLabel *)local_118,
                    (&switchD_004f308a::switchdataD_00d63cb0)[uVar35] + 0xd63cb0);
        break;
      case 4:
        tcg_out_mb(s,(TCGArg)local_118);
        break;
      default:
        goto switchD_004f308a_caseD_5;
      case 7:
        tcg_out_setcond32(s,_local_100,(TCGArg)local_118,(TCGArg)local_110,(TCGArg)local_108,
                          local_70);
        in_R9 = pTVar63;
        break;
      case 8:
        in_stack_fffffffffffffe58 = (TCGContext *)(ulong)_local_100;
        tcg_out_movcond32(s,local_f0,r,base,(TCGArg)local_108,local_70,_local_100);
        in_R9 = pTVar63;
        break;
      case 9:
      case 0x43:
        iVar21 = 0x1b6;
        goto LAB_004f3d46;
      case 10:
        iVar21 = 0x1be;
        goto LAB_004f3d46;
      case 0xb:
      case 0x45:
        iVar21 = 0x1b7;
        goto LAB_004f3d46;
      case 0xc:
        iVar21 = 0x1bf;
        goto LAB_004f3d46;
      case 0xd:
      case 0x47:
        TVar55 = TCG_TYPE_I32;
        goto LAB_004f397e;
      case 0xe:
      case 0x4a:
        if (local_78 == 0) {
          iVar21 = 0x2088;
          goto LAB_004f3d46;
        }
        tcg_out_modrm_offset(s,0xc6,0,base,(intptr_t)local_108);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
        *pbVar29 = bVar46;
        break;
      case 0xf:
      case 0x4b:
        if (local_78 == 0) {
          iVar21 = 0x489;
          goto LAB_004f3d46;
        }
        tcg_out_modrm_offset(s,0x4c7,0,base,(intptr_t)local_108);
        ptVar8 = s->code_ptr;
        *(short *)ptVar8 = (short)pTVar49;
        pTVar28 = (TCGCond *)(ptVar8 + 2);
        goto LAB_004f4003;
      case 0x10:
      case 0x4c:
        if (local_78 != 0) {
          iVar21 = 199;
          goto LAB_004f3a08;
        }
        TVar55 = TCG_TYPE_I32;
LAB_004f4084:
        tcg_out_st(s,TVar55,r,base,(intptr_t)local_108);
        break;
      case 0x11:
        goto switchD_004f308a_caseD_11;
      case 0x12:
        goto switchD_004f308a_caseD_12;
      case 0x13:
        goto switchD_004f308a_caseD_13;
      case 0x18:
        goto switchD_004f308a_caseD_18;
      case 0x19:
        goto switchD_004f308a_caseD_19;
      case 0x1a:
        iVar48 = 4;
        uVar22 = 0;
        goto switchD_004f308a_caseD_12;
      case 0x1b:
        iVar48 = 1;
        goto switchD_004f308a_caseD_12;
      case 0x1c:
        iVar48 = 6;
        goto switchD_004f308a_caseD_12;
      case 0x1d:
        goto switchD_004f308a_caseD_1d;
      case 0x1e:
        goto switchD_004f308a_caseD_1e;
      case 0x1f:
        uVar22 = 0;
        goto LAB_004f3b59;
      case 0x20:
        goto switchD_004f308a_caseD_20;
      case 0x21:
        in_R9 = (TCGContext *)&DAT_00000001;
switchD_004f308a_caseD_20:
        pTVar50 = in_R9;
        uVar22 = 0;
        goto LAB_004f3c49;
      case 0x22:
      case 0x5f:
        lVar37 = CONCAT44(uStack_fc,_local_100);
        uVar24 = CONCAT44(uStack_f4,local_f8) ^ 8;
        if (lVar37 == 0 && uVar24 == 0) {
          tcg_gen_code_x86_64_cold_9();
          break;
        }
        if (lVar37 == 8 && uVar24 == 0) {
          tcg_gen_code_x86_64_cold_4();
          break;
        }
        if ((lVar37 == 0) && (CONCAT44(uStack_f4,local_f8) == 0x10)) {
          tcg_gen_code_x86_64_cold_8();
          break;
        }
        goto LAB_004f46a0;
      case 0x23:
switchD_004f308a_caseD_23:
        if (local_118 < (TCGContext *)0x8 && local_110 < (TCGContext *)0x4) {
          iVar21 = 0x1b6;
          goto LAB_004f3af8;
        }
        tcg_out_ext16u(s,r,base);
        uVar22 = 5;
LAB_004f4051:
        TVar36 = TCG_COND_EQ;
        goto LAB_004f3c5d;
      case 0x24:
        if ((TCGContext *)0x7 < local_118 || (TCGContext *)0x3 < local_110) {
          tcg_out_opc(s,0x1bf,r,base,0);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + bVar46 * '\b' | 0xc0;
          uVar22 = 7;
          goto LAB_004f4051;
        }
        iVar21 = 0x1be;
LAB_004f3af8:
        tcg_out_opc(s,iVar21,r,base | TCG_COND_LTU,0);
        bVar17 = bVar17 + bVar46 * '\b' + 4;
        goto LAB_004f370e;
      case 0x25:
        iVar21 = 0x1ac;
        goto LAB_004f3d7a;
      case 0x26:
        in_R9 = (TCGContext *)CONCAT44(uStack_fc,_local_100);
        tcg_out_brcond32(s,TVar36,(TCGArg)local_118,(TCGArg)local_110,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe58);
        break;
      case 0x27:
        goto switchD_004f308a_caseD_27;
      case 0x28:
        goto switchD_004f308a_caseD_28;
      case 0x29:
        goto switchD_004f308a_caseD_29;
      case 0x2a:
        goto switchD_004f308a_caseD_2a;
      case 0x2f:
        goto switchD_004f308a_caseD_2f;
      case 0x30:
        goto switchD_004f308a_caseD_30;
      case 0x31:
      case 0x6b:
        tcg_out_ext8u(s,r,base);
        break;
      case 0x32:
      case 0x6c:
        tcg_out_ext16u(s,r,base);
        break;
      case 0x33:
      case 0x6e:
        tcg_out_rolw_8(s,r);
        break;
      case 0x34:
      case 0x6f:
        tcg_gen_code_x86_64_cold_15();
        break;
      case 0x35:
        goto switchD_004f308a_caseD_35;
      case 0x36:
        goto switchD_004f308a_caseD_36;
      case 0x37:
        uVar33 = 0;
        goto LAB_004f3d00;
      case 0x3c:
        iVar21 = 0;
        goto LAB_004f3b1a;
      case 0x3d:
        iVar21 = 0;
        goto LAB_004f3cac;
      case 0x3e:
        goto LAB_004f4216;
      case 0x41:
        tcg_out_setcond64(s,_local_100,(TCGArg)local_118,(TCGArg)local_110,(TCGArg)local_108,
                          local_70);
        in_R9 = pTVar63;
        break;
      case 0x42:
        in_stack_fffffffffffffe58 = (TCGContext *)(ulong)_local_100;
        tcg_out_movcond64(s,local_f0,r,base,(TCGArg)local_108,local_70,_local_100);
        in_R9 = pTVar63;
        break;
      case 0x44:
        iVar21 = 0x11be;
        goto LAB_004f3d46;
      case 0x46:
        iVar21 = 0x11bf;
        goto LAB_004f3d46;
      case 0x48:
        iVar21 = 0x1063;
LAB_004f3d46:
        tcg_out_modrm_offset(s,iVar21,r,base,(intptr_t)local_108);
        break;
      case 0x49:
        TVar55 = TCG_TYPE_I64;
LAB_004f397e:
        tcg_out_ld(s,TVar55,r,base,(intptr_t)local_108);
        break;
      case 0x4d:
        if (local_78 == 0) {
          TVar55 = TCG_TYPE_I64;
          goto LAB_004f4084;
        }
        iVar21 = 0x10c7;
LAB_004f3a08:
        tcg_out_modrm_offset(s,iVar21,0,base,(intptr_t)local_108);
        pTVar28 = (TCGCond *)s->code_ptr;
        *pTVar28 = r;
        goto LAB_004f3fff;
      case 0x4e:
        in_R9 = (TCGContext *)0x1000;
switchD_004f308a_caseD_11:
        uVar22 = (uint)in_R9;
        iVar48 = 0;
        if (local_118 == local_110) goto switchD_004f308a_caseD_12;
        if (local_70 == 0) {
          TVar36 = base;
          if (local_118 == local_108) {
LAB_004f3fbf:
            tgen_arithr(s,uVar22,r,TVar36);
            break;
          }
          in_stack_fffffffffffffe58 = (TCGContext *)0x0;
          pTVar61 = local_108;
        }
        else {
          in_stack_fffffffffffffe58 = local_108;
          pTVar61 = (TCGContext *)0xffffffffffffffff;
        }
        uVar22 = uVar22 | 0x8d;
        pTVar61 = (TCGContext *)((ulong)pTVar61 & 0xffffffff);
LAB_004f40c0:
        in_R9 = (TCGContext *)0x0;
LAB_004f40c3:
        tcg_out_modrm_sib_offset
                  (s,uVar22,r,base,(int)pTVar61,(int)in_R9,(intptr_t)in_stack_fffffffffffffe58);
        break;
      case 0x4f:
        goto switchD_004f308a_caseD_4f;
      case 0x50:
        uVar56 = 0x1000;
switchD_004f308a_caseD_13:
        if (local_70 != 0) {
          bVar17 = (bVar46 & 7) + bVar46 * '\b' | 0xc0;
          if (TVar36 == (int)(char)bVar64) {
            in_R9 = (TCGContext *)(ulong)(uVar56 | 0x6b);
            tcg_out_opc(s,uVar56 | 0x6b,r,r,0);
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar17;
LAB_004f3818:
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar64;
          }
          else {
            in_R9 = (TCGContext *)(ulong)(uVar56 | 0x69);
            tcg_out_opc(s,uVar56 | 0x69,r,r,0);
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar17;
            pTVar28 = (TCGCond *)s->code_ptr;
            *pTVar28 = TVar36;
LAB_004f3fff:
            pTVar28 = pTVar28 + 1;
LAB_004f4003:
            s->code_ptr = (tcg_insn_unit *)pTVar28;
          }
          break;
        }
        uVar56 = uVar56 | 0x1af;
        uVar33 = uVar56;
        goto LAB_004f3bd9;
      case 0x55:
switchD_004f308a_caseD_18:
        tcg_gen_code_x86_64_cold_18();
        break;
      case 0x56:
switchD_004f308a_caseD_19:
        tcg_gen_code_x86_64_cold_17();
        break;
      case 0x57:
        iVar21 = 4;
        goto switchD_004f308a_caseD_4f;
      case 0x58:
        iVar21 = 1;
        goto switchD_004f308a_caseD_4f;
      case 0x59:
        iVar21 = 6;
switchD_004f308a_caseD_4f:
        iVar48 = iVar21;
        uVar22 = 0x1000;
switchD_004f308a_caseD_12:
        uVar22 = uVar22 + iVar48;
        in_R9 = (TCGContext *)(ulong)uVar22;
        if (local_70 == 0) {
          uVar56 = (uVar22 & 0xfffffff8) + (uVar22 & 7) * 8 + 3;
          uVar33 = uVar22 & 7;
LAB_004f3bd9:
          in_R9 = (TCGContext *)(ulong)uVar33;
          tcg_out_opc(s,uVar56,r,TVar36,0);
LAB_004f3706:
          bVar17 = ((byte)TVar36 & 7) + bVar46 * '\b';
LAB_004f370e:
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar17 | 0xc0;
        }
        else {
          iVar21 = 0;
          pTVar61 = local_108;
LAB_004f3f7f:
          tgen_arithi(s,uVar22,r,(tcg_target_long)pTVar61,iVar21);
        }
        break;
      case 0x5a:
        uVar59 = 0x1000;
switchD_004f308a_caseD_1d:
        uVar22 = uVar59;
        pTVar50 = (TCGContext *)0x4;
        iVar66 = 0x6f7;
        if ((local_118 == local_110 || local_70 == 0) ||
           (&DAT_00000002 < (undefined1 *)((long)local_108[-1].regs + 0x7f)))
        goto switchD_004f308a_caseD_1e;
        uVar22 = uVar22 | 0x8d;
        pTVar61 = local_110;
        if (local_108 == (TCGContext *)&DAT_00000001) {
          in_stack_fffffffffffffe58 = (TCGContext *)0x0;
          goto LAB_004f40c0;
        }
        in_stack_fffffffffffffe58 = (TCGContext *)0x0;
        base = ~TCG_COND_NEVER;
        in_R9 = (TCGContext *)((ulong)local_108 & 0xffffffff);
        goto LAB_004f40c3;
      case 0x5b:
        uVar22 = 0x1000;
        goto switchD_004f308a_caseD_1e;
      case 0x5c:
        uVar22 = 0x1000;
LAB_004f3b59:
        pTVar50 = (TCGContext *)0x7;
        iVar66 = 0x202f7;
switchD_004f308a_caseD_1e:
        if (have_bmi2 == true) {
          if (local_70 != 0) {
            tcg_out_mov(s,(uint)(uVar22 != 0),r,base);
            goto LAB_004f3c49;
          }
          uVar22 = uVar22 + iVar66;
          in_R9 = (TCGContext *)(ulong)uVar22;
          goto LAB_004f3701;
        }
LAB_004f3c49:
        if (uVar52 != 0) {
          uVar22 = (int)pTVar50 + uVar22;
          in_R9 = (TCGContext *)(ulong)uVar22;
          goto LAB_004f3c5d;
        }
        in_R9 = pTVar50;
        tcg_out_opc(s,uVar22 + 0xd3,(int)pTVar50,r,0);
        bVar17 = (bVar46 & 7) + (char)pTVar50 * '\b';
        goto LAB_004f370e;
      case 0x5d:
        goto switchD_004f308a_caseD_5d;
      case 0x5e:
        in_R9 = (TCGContext *)&DAT_00000001;
switchD_004f308a_caseD_5d:
        pTVar50 = in_R9;
        uVar22 = 0x1000;
        goto LAB_004f3c49;
      case 0x60:
        if ((undefined1 *)((long)&local_108->pool_cur + CONCAT44(uStack_fc,_local_100)) !=
            (undefined1 *)0x20) goto switchD_004f308a_caseD_23;
        tcg_out_mov(s,TCG_TYPE_I32,r,base);
        uVar22 = 5;
        goto LAB_004f3c5d;
      case 0x62:
        iVar21 = 0x11ac;
LAB_004f3d7a:
        tcg_out_opc(s,iVar21,TVar36,r,0);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
        *pbVar29 = (bVar46 & 7) + bVar64 * '\b' | 0xc0;
        tVar16 = local_100;
LAB_004f3db5:
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = tVar16;
        break;
      case 99:
      case 0x6a:
        tcg_out_ext32s(s,r,base);
        break;
      case 100:
      case 0x65:
      case 0x6d:
        tcg_gen_code_x86_64_cold_5();
        break;
      case 0x66:
        uVar22 = 0x1005;
        TVar36 = 0x20;
LAB_004f3c5d:
        tcg_out_shifti(s,uVar22,r,TVar36);
        break;
      case 0x67:
        in_R9 = (TCGContext *)CONCAT44(uStack_fc,_local_100);
        tcg_out_brcond64(s,TVar36,(TCGArg)local_118,(TCGArg)local_110,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe58);
        break;
      case 0x68:
        in_R9 = (TCGContext *)0x1000;
switchD_004f308a_caseD_2f:
        tcg_out_ext8s(s,r,base,(int)in_R9);
        break;
      case 0x69:
        in_R9 = (TCGContext *)0x1000;
switchD_004f308a_caseD_30:
        tcg_out_ext16s(s,r,base,(int)in_R9);
        break;
      case 0x70:
        tcg_gen_code_x86_64_cold_10();
        break;
      case 0x71:
switchD_004f308a_caseD_35:
        tcg_gen_code_x86_64_cold_13();
        break;
      case 0x72:
switchD_004f308a_caseD_36:
        tcg_gen_code_x86_64_cold_14();
        break;
      case 0x73:
        uVar33 = 0x1000;
        in_R9 = (TCGContext *)&DAT_00000001;
LAB_004f3d00:
        if (local_70 == 0) {
          tcg_out_vex_opc(s,uVar33 | 0x2f2,r,TVar36,base,(TCGType)in_R9);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + bVar46 * '\b' | 0xc0;
        }
        else {
          tcg_out_mov(s,(TCGType)in_R9,r,base);
          tgen_arithi(s,uVar33 | 4,r,~(ulong)pTVar53,0);
        }
        break;
      case 0x78:
        iVar21 = 0x1000;
LAB_004f3b1a:
        in_R9 = (TCGContext *)(ulong)(local_70 != 0);
        tcg_out_clz(s,iVar21,r,base,(TCGArg)local_108,local_70 != 0);
        break;
      case 0x79:
        iVar21 = 0x1000;
LAB_004f3cac:
        in_R9 = (TCGContext *)(ulong)(local_70 != 0);
        tcg_out_ctz(s,iVar21,r,base,(TCGArg)local_108,local_70 != 0);
        break;
      case 0x7a:
LAB_004f4216:
        tcg_gen_code_x86_64_cold_16();
        break;
      case 0x7b:
        in_R9 = (TCGContext *)0x1000;
switchD_004f308a_caseD_27:
        uVar22 = (uint)in_R9;
        if (local_68 == 0) {
          tgen_arithr(s,uVar22,r,local_f8);
        }
        else {
          tgen_arithi(s,uVar22,r,CONCAT44(uStack_f4,local_f8),1);
        }
        uVar22 = uVar22 | 2;
joined_r0x004f3f6c:
        TVar36 = local_f0;
        r = base;
        if (local_64 != 0) {
          iVar21 = 1;
          pTVar61 = (TCGContext *)CONCAT44(uStack_ec,local_f0);
          goto LAB_004f3f7f;
        }
        goto LAB_004f3fbf;
      case 0x7c:
        in_R9 = (TCGContext *)0x1000;
switchD_004f308a_caseD_28:
        uVar22 = (uint)in_R9;
        uVar33 = uVar22 | 5;
        if (local_68 == 0) {
          tgen_arithr(s,uVar33,r,local_f8);
        }
        else {
          tgen_arithi(s,uVar33,r,CONCAT44(uStack_f4,local_f8),1);
        }
        uVar22 = uVar22 | 3;
        goto joined_r0x004f3f6c;
      case 0x7d:
switchD_004f308a_caseD_29:
        tcg_gen_code_x86_64_cold_12();
        break;
      case 0x7e:
switchD_004f308a_caseD_2a:
        tcg_gen_code_x86_64_cold_11();
        break;
      case 0x82:
        tcg_gen_code_x86_64_cold_7();
        break;
      case 0x83:
        if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
          tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + (long)local_118));
        }
        else {
          tcg_gen_code_x86_64_cold_3();
        }
        set_jmp_reset_offset(s,r);
        break;
      case 0x84:
        tcg_gen_code_x86_64_cold_6();
        break;
      case 0x85:
        _Var18 = false;
        goto LAB_004f3dfc;
      case 0x86:
        _Var18 = false;
        goto LAB_004f3e54;
      case 0x87:
        _Var18 = true;
LAB_004f3dfc:
        tcg_out_qemu_ld(s,(TCGArg *)&stack0xfffffffffffffee8,_Var18);
        break;
      case 0x88:
        _Var18 = true;
LAB_004f3e54:
        tcg_out_qemu_st(s,(TCGArg *)&stack0xfffffffffffffee8,_Var18);
      }
LAB_004f3724:
      unaff_R12 = unaff_R12 & 0xffffffff;
      if (uVar44 != 0) {
        uVar24 = 0;
        do {
          uVar33 = 4 << ((byte)uVar24 & 0x1f) & uVar65;
          if ((uVar65 >> ((uint)uVar24 & 0x1f) & 1) == 0) {
            if (uVar33 != 0) {
              temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar24],1);
            }
          }
          else {
            temp_sync(s,(TCGTemp *)pTVar38->args[uVar24],TVar34,0,uVar33);
          }
          uVar24 = uVar24 + 1;
        } while (uVar44 != uVar24);
      }
LAB_004f2a0b:
      if (s->code_gen_highwater < s->code_ptr) {
        unaff_R12 = 0xffffffff;
        bVar75 = false;
      }
      else {
        bVar75 = (ulong)((long)s->code_ptr - (long)s->code_buf) < 0x10000;
        unaff_R12 = unaff_R12 & 0xffffffff;
        if (!bVar75) {
          unaff_R12 = 0xfffffffe;
        }
      }
      if (!bVar75) {
        return (int)unaff_R12;
      }
      pTVar38 = (pTVar38->link).tqe_next;
    } while (pTVar38 != (TCGOp *)0x0);
  }
  s->gen_insn_end_off[local_15c] =
       (short)*(undefined4 *)&s->code_ptr - (short)*(undefined4 *)&s->code_buf;
  pTVar68 = (s->ldst_labels).sqh_first;
  if (pTVar68 == (TCGLabelQemuLdst *)0x0) {
    bVar75 = false;
    iVar21 = 0;
  }
  else {
    do {
      uVar65 = pTVar68->oi;
      uVar33 = uVar65 >> 4;
      if (pTVar68->is_ld != true) {
        *(int *)pTVar68->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar68->label_ptr[0]) + -4;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'H';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0x8b;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0xfd;
        tcg_out_mov(s,(uint)((~uVar65 & 0x30) == 0),TCG_REG_EDX,pTVar68->datalo_reg);
        tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar65);
        tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar68->raddr);
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'A';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'P';
        pptVar72 = (tcg_insn_unit **)(qemu_st_helpers + (uVar33 & 0xb));
        goto LAB_004f4537;
      }
      uVar52 = (uint)(pTVar68->type == TCG_TYPE_I64) << 0xc;
      *(int *)pTVar68->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar68->label_ptr[0]) + -4;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 'H';
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0x8b;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0xfd;
      tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar65);
      pptVar72 = &pTVar68->raddr;
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar68->raddr);
      tcg_out_branch(s,1,(tcg_insn_unit *)qemu_ld_helpers[uVar33 & 0xb]);
      TVar20 = pTVar68->datalo_reg;
      switch(uVar33 & 7) {
      default:
        TVar55 = TCG_TYPE_I32;
        break;
      case 3:
        TVar55 = TCG_TYPE_I64;
        break;
      case 4:
        uVar52 = uVar52 | 0x41be;
        goto LAB_004f4508;
      case 5:
        uVar52 = uVar52 | 0x1bf;
LAB_004f4508:
        tcg_out_opc(s,uVar52,TVar20,0,0);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
LAB_004f4534:
        *pbVar29 = (byte)TVar20 << 3 | 0xc0;
        goto LAB_004f4537;
      case 6:
        pbVar29 = *pptVar3;
        *pptVar3 = pbVar29 + 1;
        *pbVar29 = (byte)TVar20 >> 1 & 4 | 0x48;
        ptVar8 = *pptVar3;
        *pptVar3 = ptVar8 + 1;
        *ptVar8 = 'c';
        pbVar29 = *pptVar3;
        *pptVar3 = pbVar29 + 1;
        goto LAB_004f4534;
      case 7:
switchD_004f43c3_caseD_7:
        tcg_gen_code_x86_64_cold_22();
LAB_004f463f:
        __assert_fail("s->gen_insn_end_off[num_insns] == off",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                      ,0xedf,"int tcg_gen_code_x86_64(TCGContext *, TranslationBlock *)");
      }
      tcg_out_mov(s,TVar55,TVar20,TCG_REG_EAX);
LAB_004f4537:
      tcg_out_branch(s,0,*pptVar72);
      bVar75 = s->code_gen_highwater < s->code_ptr;
      if (s->code_gen_highwater < s->code_ptr) {
        iVar21 = -1;
        goto LAB_004f4578;
      }
      pTVar68 = (pTVar68->next).sqe_next;
    } while (pTVar68 != (TCGLabelQemuLdst *)0x0);
    iVar21 = 0;
  }
LAB_004f4578:
  if ((!bVar75) && (iVar21 = tcg_out_pool_finalize(s), -1 < iVar21)) {
    for (pTVar73 = (s->labels).sqh_first; pTVar73 != (TCGLabel *)0x0;
        pTVar73 = (pTVar73->next).sqe_next) {
      value = (pTVar73->u).value;
      pTVar74 = (TCGRelocation *)&pTVar73->relocs;
      while (pTVar74 = (pTVar74->next).sqe_next, pTVar74 != (TCGRelocation *)0x0) {
        _Var18 = patch_reloc(pTVar74->ptr,pTVar74->type,value,pTVar74->addend);
        if (!_Var18) goto LAB_004f45c8;
      }
    }
LAB_004f45c8:
    iVar21 = -2;
    if (pTVar73 == (TCGLabel *)0x0) {
      iVar21 = *(int *)pptVar3 - *(int *)&s->code_buf;
    }
  }
  return iVar21;
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}